

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1acccd7::Scenario::ReceivedResponse(Scenario *this,NodeId peer,uint256 *txhash)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  duration<long,_std::ratio<1L,_1000000L>_> *pdVar2;
  undefined8 *puVar3;
  long lVar4;
  Runner *pRVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar14;
  pointer ppVar15;
  long lVar16;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar5 = this->m_runner;
  uVar9 = *(undefined8 *)(txhash->super_base_blob<256U>).m_data._M_elems;
  uVar10 = *(undefined8 *)((txhash->super_base_blob<256U>).m_data._M_elems + 8);
  lVar11 = *(long *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x10);
  lVar12 = *(long *)((txhash->super_base_blob<256U>).m_data._M_elems + 0x18);
  ppVar6 = (pRVar5->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (undefined4)uVar9;
  uStack_54 = (undefined4)((ulong)uVar9 >> 0x20);
  uStack_50 = (undefined4)uVar10;
  uStack_4c = (undefined4)((ulong)uVar10 >> 0x20);
  if (ppVar6 == (pRVar5->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = &pRVar5->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(this_00,1,"vector::_M_realloc_insert");
    ppVar7 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar16 = (long)ppVar6 - (long)ppVar7 >> 3;
    if (__n == 0) {
      ppVar14 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                 *)0x0;
    }
    else {
      ppVar14 = __gnu_cxx::
                new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                            *)this_00,__n,(void *)0x0);
    }
    pdVar2 = &ppVar14->first + lVar16;
    pdVar2->__r = (this->m_now).__r;
    puVar3 = (undefined8 *)((long)&(ppVar14->second).super__Function_base._M_functor + lVar16 * 8);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    plVar13 = (long *)operator_new(0x30);
    *plVar13 = (long)pRVar5;
    plVar13[1] = peer;
    local_48 = (undefined4)lVar11;
    uStack_44 = (undefined4)((ulong)lVar11 >> 0x20);
    uStack_40 = (undefined4)lVar12;
    uStack_3c = (undefined4)((ulong)lVar12 >> 0x20);
    *(undefined4 *)(plVar13 + 2) = local_58;
    *(undefined4 *)((long)plVar13 + 0x14) = uStack_54;
    *(undefined4 *)(plVar13 + 3) = uStack_50;
    *(undefined4 *)((long)plVar13 + 0x1c) = uStack_4c;
    *(undefined4 *)(plVar13 + 4) = local_48;
    *(undefined4 *)((long)plVar13 + 0x24) = uStack_44;
    *(undefined4 *)(plVar13 + 5) = uStack_40;
    *(undefined4 *)((long)plVar13 + 0x2c) = uStack_3c;
    *(long **)&(((function<void_()> *)(pdVar2 + 1))->super__Function_base)._M_functor = plVar13;
    pdVar2[4] = (duration<long,_std::ratio<1L,_1000000L>_>)
                _GLOBAL__N_1::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
                ::_M_invoke;
    pdVar2[3] = (duration<long,_std::ratio<1L,_1000000L>_>)
                _GLOBAL__N_1::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
                ::_M_manager;
    ppVar15 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar7,ppVar6,ppVar14,this_00);
    ppVar15 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar6,ppVar8,ppVar15 + 1,this_00);
    if (ppVar7 != (pointer)0x0) {
      operator_delete(ppVar7,(long)(pRVar5->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar7
                     );
    }
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar14;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar15;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar14 + __n;
  }
  else {
    (ppVar6->first).__r = (this->m_now).__r;
    *(undefined8 *)&(ppVar6->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar6->second).super__Function_base._M_functor + 8) = 0;
    (ppVar6->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar6->second)._M_invoker = (_Invoker_type)0x0;
    plVar13 = (long *)operator_new(0x30);
    *plVar13 = (long)pRVar5;
    plVar13[1] = peer;
    *(undefined4 *)(plVar13 + 2) = local_58;
    *(undefined4 *)((long)plVar13 + 0x14) = uStack_54;
    *(undefined4 *)(plVar13 + 3) = uStack_50;
    *(undefined4 *)((long)plVar13 + 0x1c) = uStack_4c;
    plVar13[4] = lVar11;
    plVar13[5] = lVar12;
    *(long **)&(ppVar6->second).super__Function_base._M_functor = plVar13;
    (ppVar6->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_invoke;
    (ppVar6->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:146:44)>
         ::_M_manager;
    pppVar1 = &(pRVar5->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedResponse(NodeId peer, const uint256& txhash)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedResponse(peer, txhash);
            runner.txrequest.SanityCheck();
        });
    }